

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  termios oldt;
  termios local_98;
  termios local_5c;
  
  crnlib_is_debugger_present();
  uVar2 = main_internal(argc,argv);
  crnlib::console::printf("\nExit status: %i",(ulong)uVar2);
  bVar1 = check_for_option(argc,argv,"pause");
  if ((bVar1) && (uVar2 != 0 || crnlib::console::m_num_messages._24_4_ != 0)) {
    crnlib::console::m_output_disabled = 0;
    crnlib::console::message("\nPress a key to continue.");
    do {
      tcgetattr(0,&local_5c);
      local_98.c_iflag = local_5c.c_iflag;
      local_98.c_oflag = local_5c.c_oflag;
      local_98.c_line = local_5c.c_line;
      local_98.c_cc[0] = local_5c.c_cc[0];
      local_98.c_cc[1] = local_5c.c_cc[1];
      local_98.c_cc[2] = local_5c.c_cc[2];
      local_98.c_cc[3] = local_5c.c_cc[3];
      local_98.c_cc[4] = local_5c.c_cc[4];
      local_98.c_cc[5] = local_5c.c_cc[5];
      local_98.c_cc[6] = local_5c.c_cc[6];
      local_98.c_cc[7] = local_5c.c_cc[7];
      local_98.c_cc[8] = local_5c.c_cc[8];
      local_98.c_cc[9] = local_5c.c_cc[9];
      local_98.c_cc[10] = local_5c.c_cc[10];
      local_98.c_cc[0xb] = local_5c.c_cc[0xb];
      local_98.c_cc[0xc] = local_5c.c_cc[0xc];
      local_98.c_cc[0xd] = local_5c.c_cc[0xd];
      local_98.c_cc[0xe] = local_5c.c_cc[0xe];
      local_98.c_cc[0xf] = local_5c.c_cc[0xf];
      local_98.c_cc[0x10] = local_5c.c_cc[0x10];
      local_98.c_cc[0x11] = local_5c.c_cc[0x11];
      local_98.c_cc[0x12] = local_5c.c_cc[0x12];
      local_98.c_cc[0x13] = local_5c.c_cc[0x13];
      local_98.c_cc[0x14] = local_5c.c_cc[0x14];
      local_98.c_cc[0x15] = local_5c.c_cc[0x15];
      local_98.c_cc[0x16] = local_5c.c_cc[0x16];
      local_98.c_ispeed = local_5c.c_ispeed;
      local_98.c_ospeed = local_5c.c_ospeed;
      local_98._8_8_ = local_5c._8_8_ & 0xfffffff5ffffffff;
      tcsetattr(0,0,&local_98);
      iVar3 = getchar();
      tcsetattr(0,0,&local_5c);
    } while (iVar3 == -1);
  }
  return uVar2;
}

Assistant:

int main(int argc, char* argv[])
{
    int status = EXIT_FAILURE;

    if (crnlib_is_debugger_present())
    {
        status = main_internal(argc, argv);
    }
    else
    {
#ifdef _MSC_VER
        __try
        {
            status = main_internal(argc, argv);
        }
        __except (EXCEPTION_EXECUTE_HANDLER)
        {
            console::error("Uncached exception! crunch command line tool failed!");
        }
#else
        status = main_internal(argc, argv);
#endif
    }

    console::printf("\nExit status: %i", status);

    if (check_for_option(argc, argv, "pause"))
    {
        if ((status == EXIT_FAILURE) || (console::get_num_messages(cErrorConsoleMessage)))
        {
            pause_and_wait();
        }
    }

    return status;
}